

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasCordFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  CppType CVar2;
  long lVar3;
  int i;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    if (*(int *)(descriptor + 0x68) <= lVar4) {
      lVar4 = -1;
      lVar5 = 0;
      do {
        lVar3 = (long)*(int *)(descriptor + 0x70);
        lVar4 = lVar4 + 1;
        if (lVar3 <= lVar4) {
          return lVar4 < lVar3;
        }
        bVar1 = HasCordFields((Descriptor *)(lVar5 + *(long *)(descriptor + 0x38)),options);
        lVar5 = lVar5 + 0x90;
      } while (!bVar1);
      return lVar4 < lVar3;
    }
    lVar3 = *(long *)(descriptor + 0x28);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)(lVar5 + lVar3));
    if (((CVar2 == CPPTYPE_STRING) && (options->opensource_runtime == false)) &&
       (*(int *)(*(long *)(lVar3 + 0x78 + lVar5) + 0x48) == 1)) break;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x98;
  }
  return true;
}

Assistant:

static bool HasCordFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsCordField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasCordFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}